

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Materials.cpp
# Opt level: O0

SP __thiscall pbrt::SemanticParser::createMaterial_translucent(SemanticParser *this,SP *in)

{
  bool bVar1;
  element_type *__s;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  SemanticParser *in_RDI;
  SP SVar3;
  SP mat;
  element_type *in_stack_fffffffffffffe48;
  vec3f *in_stack_fffffffffffffe50;
  string *in_stack_fffffffffffffe58;
  ParamSet *in_stack_fffffffffffffe60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  allocator<char> *in_stack_fffffffffffffe80;
  allocator<char> *__a;
  char *in_stack_fffffffffffffe88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  SemanticParser *this_01;
  allocator<char> local_119;
  string local_118 [39];
  allocator<char> local_f1;
  string local_f0 [24];
  string *in_stack_ffffffffffffff28;
  float *in_stack_ffffffffffffff30;
  ParamSet *in_stack_ffffffffffffff38;
  string *in_stack_ffffffffffffff40;
  ParamSet *in_stack_ffffffffffffff48;
  allocator<char> local_a9;
  string local_a8 [39];
  allocator<char> local_81;
  string local_80 [55];
  allocator<char> local_49;
  string local_48 [72];
  
  this_01 = in_RDI;
  std::__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1b670b);
  std::make_shared<pbrt::TranslucentMaterial,std::__cxx11::string&>(in_stack_fffffffffffffe78);
  std::__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1b672e);
  std::__shared_ptr_access<pbrt::TranslucentMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<pbrt::TranslucentMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1b6740);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  syntactic::ParamSet::getParam3f
            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  __s = std::
        __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1b67c2);
  peVar2 = std::
           __shared_ptr_access<pbrt::TranslucentMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<pbrt::TranslucentMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1b67d4);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&peVar2->reflect;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,in_stack_fffffffffffffe80);
  syntactic::ParamSet::getParam3f
            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator(&local_81);
  std::__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1b6847);
  __a = &local_a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  bVar1 = syntactic::ParamSet::hasParamTexture(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator(&local_a9);
  if (bVar1) {
    std::__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1b68c2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
    syntactic::ParamSet::getParamTexture(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    findOrCreateTexture(this_01,(SP *)in_RDI);
    std::__shared_ptr_access<pbrt::TranslucentMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<pbrt::TranslucentMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1b6939);
    std::shared_ptr<pbrt::Texture>::operator=
              ((shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffe50,
               (shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffe48);
    std::shared_ptr<pbrt::Texture>::~shared_ptr((shared_ptr<pbrt::Texture> *)0x1b695a);
    std::shared_ptr<pbrt::syntactic::Texture>::~shared_ptr
              ((shared_ptr<pbrt::syntactic::Texture> *)0x1b6967);
    std::__cxx11::string::~string(local_f0);
    std::allocator<char>::~allocator(&local_f1);
  }
  else {
    in_stack_fffffffffffffe48 =
         std::
         __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)0x1b6ad7);
    peVar2 = std::
             __shared_ptr_access<pbrt::TranslucentMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<pbrt::TranslucentMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1b6ae8);
    in_stack_fffffffffffffe50 = &peVar2->kd;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
    syntactic::ParamSet::getParam3f
              (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    std::__cxx11::string::~string(local_118);
    std::allocator<char>::~allocator(&local_119);
  }
  std::shared_ptr<pbrt::Material>::shared_ptr<pbrt::TranslucentMaterial,void>
            ((shared_ptr<pbrt::Material> *)in_stack_fffffffffffffe50,
             (shared_ptr<pbrt::TranslucentMaterial> *)in_stack_fffffffffffffe48);
  std::shared_ptr<pbrt::TranslucentMaterial>::~shared_ptr
            ((shared_ptr<pbrt::TranslucentMaterial> *)0x1b6bb7);
  SVar3.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  SVar3.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this_01;
  return (SP)SVar3.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Material::SP SemanticParser::createMaterial_translucent(pbrt::syntactic::Material::SP in)
  {
    TranslucentMaterial::SP mat = std::make_shared<TranslucentMaterial>(in->name);

    in->getParam3f(&mat->transmit.x,"transmit");
    in->getParam3f(&mat->reflect.x,"reflect");
    if (in->hasParamTexture("Kd"))
      mat->map_kd = findOrCreateTexture(in->getParamTexture("Kd"));
    else
      in->getParam3f(&mat->kd.x,"Kd");
          
    return mat;
  }